

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error adios2_remove_all_attributes(adios2_io *io)

{
  string *in_stack_00000028;
  adios2_io *in_stack_00000030;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"for adios2_io, in call to adios2_remove_all_attributes",&local_31);
  adios2::helper::CheckForNullptr<adios2_io>(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  adios2::core::IO::RemoveAllAttributes();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_remove_all_attributes(adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_remove_all_attributes");
        reinterpret_cast<adios2::core::IO *>(io)->RemoveAllAttributes();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_remove_attribute"));
    }
}